

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::StrictMock<MockUnaryVisitor>::StrictMock(StrictMock<MockUnaryVisitor> *this)

{
  MockUnaryVisitor *in_RDI;
  MockUnaryVisitor *in_stack_fffffffffffffff0;
  
  MockUnaryVisitor::MockUnaryVisitor(in_stack_fffffffffffffff0);
  (in_RDI->super_ExprVisitor<MockUnaryVisitor,_TestResult>).
  super_BasicExprVisitor<MockUnaryVisitor,_TestResult,_mp::internal::ExprTypes>.
  _vptr_BasicExprVisitor = (_func_int **)&PTR__StrictMock_002a2f78;
  internal::ImplicitCast_<MockUnaryVisitor*>(in_RDI);
  Mock::FailUninterestingCalls((void *)0x150a5b);
  return;
}

Assistant:

StrictMock() {
    ::testing::Mock::FailUninterestingCalls(
        internal::ImplicitCast_<MockClass*>(this));
  }